

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heartbeat_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::HeartbeatMessageTest_test_to_string_Test::TestBody
          (HeartbeatMessageTest_test_to_string_Test *this)

{
  bool bVar1;
  char *message_00;
  AssertHelper local_68;
  Message local_60 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  HeartbeatMessage message;
  HeartbeatMessageTest_test_to_string_Test *this_local;
  
  bidfx_public_api::price::pixie::HeartbeatMessage::HeartbeatMessage
            ((HeartbeatMessage *)&gtest_ar.message_);
  bidfx_public_api::price::pixie::HeartbeatMessage::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<char[12],std::__cxx11::string>
            ((EqHelper<false> *)local_28,"\"Heartbeat()\"","message.ToString()",
             (char (*) [12])"Heartbeat()",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message_00 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/heartbeat_message_test.cpp"
               ,0x2b,message_00);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  return;
}

Assistant:

TEST(HeartbeatMessageTest, test_to_string)
{
    HeartbeatMessage message;
    EXPECT_EQ("Heartbeat()", message.ToString());
}